

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

gfield * __thiscall gfield::sub<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  gfint tmp;
  bigint<13> bStack_38;
  
  uVar1 = x->len;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < y->len) {
LAB_0015cb85:
    bigint<13>::add<13,13>(&bStack_38,x,&P.super_gfint);
    x = &bStack_38;
  }
  else if ((int)uVar1 <= y->len) {
    do {
      if ((int)uVar4 < 1) break;
      lVar2 = uVar4 - 1;
      lVar3 = uVar4 - 1;
      if (x->digits[lVar2] < y->digits[lVar3]) goto LAB_0015cb85;
      uVar4 = uVar4 - 1;
    } while (x->digits[lVar2] <= y->digits[lVar3]);
  }
  bigint<13>::sub<13,13>(&this->super_gfint,x,y);
  return this;
}

Assistant:

gfield &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(x < y)
        {
            gfint tmp; /* necessary if this==&y, using this instead would clobber y */
            tmp.add(x, P);
            gfint::sub(tmp, y);
        }
        else gfint::sub(x, y);
        return *this;
    }